

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  float *vertices;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  Scene *pSVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  vint4 bi_1;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 ai;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [64];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar73 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1360 [16];
  Scene *local_1350;
  ulong local_1348;
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  RTCFilterFunctionNArguments local_12e0;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [16];
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined4 local_10a0;
  undefined4 uStack_109c;
  undefined4 uStack_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar51 [32];
  undefined1 auVar55 [32];
  
  pauVar10 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1210._4_4_ = fVar58;
  local_1210._0_4_ = fVar58;
  local_1210._8_4_ = fVar58;
  local_1210._12_4_ = fVar58;
  auVar64 = ZEXT1664(local_1210);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1220._4_4_ = fVar65;
  local_1220._0_4_ = fVar65;
  local_1220._8_4_ = fVar65;
  local_1220._12_4_ = fVar65;
  auVar69 = ZEXT1664(local_1220);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1230._4_4_ = fVar70;
  local_1230._0_4_ = fVar70;
  local_1230._8_4_ = fVar70;
  local_1230._12_4_ = fVar70;
  auVar73 = ZEXT1664(local_1230);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar70 = fVar70 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1310 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar26 = local_1310 ^ 0x10;
  uVar25 = local_12e8 ^ 0x10;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar37 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  local_1200._8_4_ = 0x80000000;
  local_1200._0_8_ = 0x8000000080000000;
  local_1200._12_4_ = 0x80000000;
  local_1240._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  local_1240._8_4_ = -fVar58;
  local_1240._12_4_ = -fVar58;
  auVar79 = ZEXT1664(local_1240);
  local_1250._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_1250._8_4_ = -fVar65;
  local_1250._12_4_ = -fVar65;
  auVar81 = ZEXT1664(local_1250);
  local_1260._0_8_ = CONCAT44(fVar70,fVar70) ^ 0x8000000080000000;
  local_1260._8_4_ = -fVar70;
  local_1260._12_4_ = -fVar70;
  auVar84 = ZEXT1664(local_1260);
  iVar8 = (tray->tnear).field_0.i[k];
  local_1270._4_4_ = iVar8;
  local_1270._0_4_ = iVar8;
  local_1270._8_4_ = iVar8;
  local_1270._12_4_ = iVar8;
  auVar86 = ZEXT1664(local_1270);
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar45._4_4_ = iVar8;
  auVar45._0_4_ = iVar8;
  auVar45._8_4_ = iVar8;
  auVar45._12_4_ = iVar8;
  auVar45._16_4_ = iVar8;
  auVar45._20_4_ = iVar8;
  auVar45._24_4_ = iVar8;
  auVar45._28_4_ = iVar8;
  auVar51 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar45 = vpand_avx2(auVar45,auVar51);
  local_10e0 = vpcmpeqd_avx2(auVar45,auVar51);
  uVar11 = local_1310;
LAB_00567b72:
  do {
    pauVar7 = pauVar10 + -1;
    pauVar10 = pauVar10 + -1;
    if (*(float *)(*pauVar7 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar27 = *(ulong *)*pauVar10;
      while ((uVar27 & 8) == 0) {
        uVar22 = uVar27 & 0xfffffffffffffff0;
        uVar9 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar38._4_4_ = uVar9;
        auVar38._0_4_ = uVar9;
        auVar38._8_4_ = uVar9;
        auVar38._12_4_ = uVar9;
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar11),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + uVar11));
        auVar39 = vfmadd213ps_fma(auVar39,auVar64._0_16_,auVar79._0_16_);
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar19),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + uVar19));
        auVar46 = vfmadd213ps_fma(auVar46,auVar69._0_16_,auVar81._0_16_);
        auVar39 = vpmaxsd_avx(auVar39,auVar46);
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + local_12e8),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + local_12e8));
        auVar46 = vfmadd213ps_fma(auVar46,auVar73._0_16_,auVar84._0_16_);
        auVar46 = vpmaxsd_avx(auVar46,auVar86._0_16_);
        local_10c0 = vpmaxsd_avx(auVar39,auVar46);
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar26),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + uVar26));
        auVar39 = vfmadd213ps_fma(auVar39,auVar64._0_16_,auVar79._0_16_);
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + (uVar19 ^ 0x10)),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + (uVar19 ^ 0x10)));
        auVar46 = vfmadd213ps_fma(auVar46,auVar69._0_16_,auVar81._0_16_);
        auVar39 = vpminsd_avx(auVar39,auVar46);
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar22 + 0x80 + uVar25),auVar38,
                                  *(undefined1 (*) [16])(uVar22 + 0x20 + uVar25));
        auVar46 = vfmadd213ps_fma(auVar46,auVar73._0_16_,auVar84._0_16_);
        auVar46 = vpminsd_avx(auVar46,auVar37._0_16_);
        auVar39 = vpminsd_avx(auVar39,auVar46);
        if (((uint)uVar27 & 7) == 6) {
          auVar46 = vcmpps_avx(local_10c0,auVar39,2);
          auVar39 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0xe0),auVar38,2);
          auVar38 = vcmpps_avx(auVar38,*(undefined1 (*) [16])(uVar22 + 0xf0),1);
          auVar39 = vandps_avx(auVar39,auVar38);
          auVar39 = vandps_avx(auVar39,auVar46);
        }
        else {
          auVar39 = vcmpps_avx(local_10c0,auVar39,2);
        }
        auVar39 = vpslld_avx(auVar39,0x1f);
        uVar13 = vmovmskps_avx(auVar39);
        if (uVar13 == 0) {
          if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00567b72;
        }
        uVar13 = uVar13 & 0xff;
        lVar6 = 0;
        for (uVar27 = (ulong)uVar13; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          lVar6 = lVar6 + 1;
        }
        uVar27 = *(ulong *)(uVar22 + lVar6 * 8);
        uVar13 = uVar13 - 1 & uVar13;
        uVar14 = (ulong)uVar13;
        if (uVar13 != 0) {
          uVar74 = *(uint *)((RTCHitN *)local_10c0 + lVar6 * 4);
          lVar6 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar6 = lVar6 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar17 = (ulong)uVar13;
          uVar14 = *(ulong *)(uVar22 + lVar6 * 8);
          uVar75 = *(uint *)((RTCHitN *)local_10c0 + lVar6 * 4);
          if (uVar13 == 0) {
            if (uVar74 < uVar75) {
              *(ulong *)*pauVar10 = uVar14;
              *(uint *)(*pauVar10 + 8) = uVar75;
              pauVar10 = pauVar10 + 1;
            }
            else {
              *(ulong *)*pauVar10 = uVar27;
              *(uint *)(*pauVar10 + 8) = uVar74;
              pauVar10 = pauVar10 + 1;
              uVar27 = uVar14;
            }
          }
          else {
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar27;
            auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar74));
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar14;
            auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar75));
            lVar6 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar6 = lVar6 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar27 = (ulong)uVar13;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *(ulong *)(uVar22 + lVar6 * 8);
            auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar6 * 4)))
            ;
            auVar38 = vpcmpgtd_avx(auVar46,auVar39);
            if (uVar13 == 0) {
              auVar59 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar46,auVar39,auVar59);
              auVar39 = vblendvps_avx(auVar39,auVar46,auVar59);
              auVar46 = vpcmpgtd_avx(auVar52,auVar38);
              auVar59 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar52,auVar38,auVar59);
              auVar38 = vblendvps_avx(auVar38,auVar52,auVar59);
              auVar52 = vpcmpgtd_avx(auVar38,auVar39);
              auVar59 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar38,auVar39,auVar59);
              auVar39 = vblendvps_avx(auVar39,auVar38,auVar59);
              *pauVar10 = auVar39;
              pauVar10[1] = auVar52;
              uVar27 = auVar46._0_8_;
              pauVar10 = pauVar10 + 2;
            }
            else {
              lVar6 = 0;
              for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar6 = lVar6 + 1;
              }
              auVar59._8_8_ = 0;
              auVar59._0_8_ = *(ulong *)(uVar22 + lVar6 * 8);
              auVar32 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar6 * 4)
                                                       ));
              auVar59 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar46,auVar39,auVar59);
              auVar39 = vblendvps_avx(auVar39,auVar46,auVar59);
              auVar46 = vpcmpgtd_avx(auVar32,auVar52);
              auVar59 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar32,auVar52,auVar59);
              auVar52 = vblendvps_avx(auVar52,auVar32,auVar59);
              auVar59 = vpcmpgtd_avx(auVar52,auVar39);
              auVar32 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar52,auVar39,auVar32);
              auVar39 = vblendvps_avx(auVar39,auVar52,auVar32);
              auVar52 = vpcmpgtd_avx(auVar46,auVar38);
              auVar32 = vpshufd_avx(auVar52,0xaa);
              auVar52 = vblendvps_avx(auVar46,auVar38,auVar32);
              auVar46 = vblendvps_avx(auVar38,auVar46,auVar32);
              auVar38 = vpcmpgtd_avx(auVar59,auVar46);
              auVar32 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar59,auVar46,auVar32);
              auVar46 = vblendvps_avx(auVar46,auVar59,auVar32);
              *pauVar10 = auVar39;
              pauVar10[1] = auVar46;
              pauVar10[2] = auVar38;
              uVar27 = auVar52._0_8_;
              pauVar10 = pauVar10 + 3;
            }
          }
        }
      }
      local_1308 = (ulong)((uint)uVar27 & 0xf) - 8;
      if (local_1308 != 0) {
        uVar27 = uVar27 & 0xfffffffffffffff0;
        uVar11 = 0;
        do {
          lVar15 = uVar11 * 0x50;
          pSVar16 = context->scene;
          pGVar3 = (pSVar16->geometries).items[*(uint *)(uVar27 + 0x30 + lVar15)].ptr;
          fVar58 = (pGVar3->time_range).lower;
          fVar58 = pGVar3->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar58) /
                   ((pGVar3->time_range).upper - fVar58));
          auVar39 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
          auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
          auVar40 = vmaxss_avx(ZEXT816(0),auVar39);
          lVar12 = (long)(int)auVar40._0_4_ * 0x38;
          uVar24 = (ulong)*(uint *)(uVar27 + 4 + lVar15);
          lVar6 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar12);
          lVar12 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar12);
          auVar39 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar27 + lVar15) * 4);
          uVar23 = (ulong)*(uint *)(uVar27 + 0x10 + lVar15);
          auVar46 = *(undefined1 (*) [16])(lVar6 + uVar23 * 4);
          uVar22 = (ulong)*(uint *)(uVar27 + 0x20 + lVar15);
          auVar48 = *(undefined1 (*) [16])(lVar6 + uVar22 * 4);
          auVar38 = *(undefined1 (*) [16])(lVar6 + uVar24 * 4);
          uVar14 = (ulong)*(uint *)(uVar27 + 0x14 + lVar15);
          auVar52 = *(undefined1 (*) [16])(lVar6 + uVar14 * 4);
          uVar17 = (ulong)*(uint *)(uVar27 + 0x24 + lVar15);
          auVar53 = *(undefined1 (*) [16])(lVar6 + uVar17 * 4);
          uVar18 = (ulong)*(uint *)(uVar27 + 8 + lVar15);
          auVar59 = *(undefined1 (*) [16])(lVar6 + uVar18 * 4);
          local_12f8 = (ulong)*(uint *)(uVar27 + 0x18 + lVar15);
          auVar32 = *(undefined1 (*) [16])(lVar6 + local_12f8 * 4);
          uVar20 = (ulong)*(uint *)(uVar27 + 0x28 + lVar15);
          auVar28 = *(undefined1 (*) [16])(lVar6 + uVar20 * 4);
          uVar21 = (ulong)*(uint *)(uVar27 + 0xc + lVar15);
          auVar34 = *(undefined1 (*) [16])(lVar6 + uVar21 * 4);
          local_1300 = (ulong)*(uint *)(uVar27 + 0x1c + lVar15);
          auVar29 = *(undefined1 (*) [16])(lVar6 + local_1300 * 4);
          local_12f0 = (ulong)*(uint *)(uVar27 + 0x2c + lVar15);
          auVar30 = *(undefined1 (*) [16])(lVar6 + local_12f0 * 4);
          auVar31 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar27 + lVar15) * 4);
          auVar41 = *(undefined1 (*) [16])(lVar12 + uVar23 * 4);
          fVar58 = fVar58 - auVar40._0_4_;
          auVar40 = vunpcklps_avx(auVar39,auVar59);
          auVar59 = vunpckhps_avx(auVar39,auVar59);
          auVar47 = vunpcklps_avx(auVar38,auVar34);
          auVar38 = vunpckhps_avx(auVar38,auVar34);
          auVar39 = *(undefined1 (*) [16])(lVar12 + uVar24 * 4);
          local_11e0 = vunpcklps_avx(auVar59,auVar38);
          auVar34 = vunpcklps_avx(auVar40,auVar47);
          auVar59 = vunpckhps_avx(auVar40,auVar47);
          auVar40 = vunpcklps_avx(auVar46,auVar32);
          auVar38 = vunpckhps_avx(auVar46,auVar32);
          auVar32 = vunpcklps_avx(auVar52,auVar29);
          auVar52 = vunpckhps_avx(auVar52,auVar29);
          auVar46 = *(undefined1 (*) [16])(lVar12 + uVar18 * 4);
          local_11d0 = vunpcklps_avx(auVar38,auVar52);
          auVar29 = vunpcklps_avx(auVar40,auVar32);
          local_11f0 = vunpckhps_avx(auVar40,auVar32);
          auVar40 = vunpcklps_avx(auVar48,auVar28);
          auVar52 = vunpckhps_avx(auVar48,auVar28);
          auVar28 = vunpcklps_avx(auVar53,auVar30);
          auVar32 = vunpckhps_avx(auVar53,auVar30);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar21 * 4);
          local_1330 = vunpcklps_avx(auVar52,auVar32);
          local_1340 = vunpcklps_avx(auVar40,auVar28);
          local_11c0 = vunpckhps_avx(auVar40,auVar28);
          auVar52 = vunpcklps_avx(auVar31,auVar46);
          auVar46 = vunpckhps_avx(auVar31,auVar46);
          auVar32 = vunpcklps_avx(auVar39,auVar38);
          auVar38 = vunpckhps_avx(auVar39,auVar38);
          auVar39 = *(undefined1 (*) [16])(lVar12 + local_12f8 * 4);
          auVar28 = vunpcklps_avx(auVar46,auVar38);
          auVar30 = vunpcklps_avx(auVar52,auVar32);
          auVar38 = vunpckhps_avx(auVar52,auVar32);
          auVar32 = vunpcklps_avx(auVar41,auVar39);
          auVar52 = vunpckhps_avx(auVar41,auVar39);
          auVar39 = *(undefined1 (*) [16])(lVar12 + uVar14 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar12 + local_1300 * 4);
          auVar31 = vunpcklps_avx(auVar39,auVar46);
          auVar39 = vunpckhps_avx(auVar39,auVar46);
          auVar41 = vunpcklps_avx(auVar52,auVar39);
          auVar40 = vunpcklps_avx(auVar32,auVar31);
          auVar52 = vunpckhps_avx(auVar32,auVar31);
          auVar39 = *(undefined1 (*) [16])(lVar12 + uVar22 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar12 + uVar20 * 4);
          auVar31 = vunpcklps_avx(auVar39,auVar46);
          auVar32 = vunpckhps_avx(auVar39,auVar46);
          auVar39 = *(undefined1 (*) [16])(lVar12 + uVar17 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar12 + local_12f0 * 4);
          auVar47 = vunpcklps_avx(auVar39,auVar46);
          auVar39 = vunpckhps_avx(auVar39,auVar46);
          auVar46 = vunpcklps_avx(auVar32,auVar39);
          auVar32 = vunpcklps_avx(auVar31,auVar47);
          auVar39 = vunpckhps_avx(auVar31,auVar47);
          fVar65 = 1.0 - fVar58;
          auVar82._4_4_ = fVar65;
          auVar82._0_4_ = fVar65;
          auVar82._8_4_ = fVar65;
          auVar82._12_4_ = fVar65;
          auVar60._0_4_ = fVar58 * auVar30._0_4_;
          auVar60._4_4_ = fVar58 * auVar30._4_4_;
          auVar60._8_4_ = fVar58 * auVar30._8_4_;
          auVar60._12_4_ = fVar58 * auVar30._12_4_;
          auVar34 = vfmadd231ps_fma(auVar60,auVar82,auVar34);
          auVar61._0_4_ = fVar58 * auVar38._0_4_;
          auVar61._4_4_ = fVar58 * auVar38._4_4_;
          auVar61._8_4_ = fVar58 * auVar38._8_4_;
          auVar61._12_4_ = fVar58 * auVar38._12_4_;
          auVar30 = vfmadd231ps_fma(auVar61,auVar82,auVar59);
          auVar66._0_4_ = fVar58 * auVar28._0_4_;
          auVar66._4_4_ = fVar58 * auVar28._4_4_;
          auVar66._8_4_ = fVar58 * auVar28._8_4_;
          auVar66._12_4_ = fVar58 * auVar28._12_4_;
          auVar31 = vfmadd231ps_fma(auVar66,auVar82,local_11e0);
          auVar28._0_4_ = fVar58 * auVar40._0_4_;
          auVar28._4_4_ = fVar58 * auVar40._4_4_;
          auVar28._8_4_ = fVar58 * auVar40._8_4_;
          auVar28._12_4_ = fVar58 * auVar40._12_4_;
          auVar38 = vfmadd231ps_fma(auVar28,auVar82,auVar29);
          auVar40._0_4_ = fVar58 * auVar52._0_4_;
          auVar40._4_4_ = fVar58 * auVar52._4_4_;
          auVar40._8_4_ = fVar58 * auVar52._8_4_;
          auVar40._12_4_ = fVar58 * auVar52._12_4_;
          auVar52 = vfmadd231ps_fma(auVar40,auVar82,local_11f0);
          auVar47._0_4_ = fVar58 * auVar41._0_4_;
          auVar47._4_4_ = fVar58 * auVar41._4_4_;
          auVar47._8_4_ = fVar58 * auVar41._8_4_;
          auVar47._12_4_ = fVar58 * auVar41._12_4_;
          auVar59 = vfmadd231ps_fma(auVar47,auVar82,local_11d0);
          puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar15);
          local_11b0 = *puVar1;
          uStack_11a8 = puVar1[1];
          puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar15);
          auVar56._0_4_ = fVar58 * auVar32._0_4_;
          auVar56._4_4_ = fVar58 * auVar32._4_4_;
          auVar56._8_4_ = fVar58 * auVar32._8_4_;
          auVar56._12_4_ = fVar58 * auVar32._12_4_;
          auVar77._0_4_ = fVar58 * auVar39._0_4_;
          auVar77._4_4_ = fVar58 * auVar39._4_4_;
          auVar77._8_4_ = fVar58 * auVar39._8_4_;
          auVar77._12_4_ = fVar58 * auVar39._12_4_;
          auVar85._0_4_ = fVar58 * auVar46._0_4_;
          auVar85._4_4_ = fVar58 * auVar46._4_4_;
          auVar85._8_4_ = fVar58 * auVar46._8_4_;
          auVar85._12_4_ = fVar58 * auVar46._12_4_;
          auVar32 = vfmadd231ps_fma(auVar56,auVar82,local_1340);
          auVar28 = vfmadd231ps_fma(auVar77,auVar82,local_11c0);
          auVar29 = vfmadd231ps_fma(auVar85,auVar82,local_1330);
          local_12b0 = *puVar1;
          uStack_12a8 = puVar1[1];
          auVar46 = vsubps_avx(auVar34,auVar38);
          auVar39 = vsubps_avx(auVar30,auVar52);
          auVar38 = vsubps_avx(auVar31,auVar59);
          auVar52 = vsubps_avx(auVar32,auVar34);
          auVar59 = vsubps_avx(auVar28,auVar30);
          auVar32 = vsubps_avx(auVar29,auVar31);
          auVar41._0_4_ = auVar39._0_4_ * auVar32._0_4_;
          auVar41._4_4_ = auVar39._4_4_ * auVar32._4_4_;
          auVar41._8_4_ = auVar39._8_4_ * auVar32._8_4_;
          auVar41._12_4_ = auVar39._12_4_ * auVar32._12_4_;
          local_1110 = vfmsub231ps_fma(auVar41,auVar59,auVar38);
          auVar53._0_4_ = auVar38._0_4_ * auVar52._0_4_;
          auVar53._4_4_ = auVar38._4_4_ * auVar52._4_4_;
          auVar53._8_4_ = auVar38._8_4_ * auVar52._8_4_;
          auVar53._12_4_ = auVar38._12_4_ * auVar52._12_4_;
          local_1100 = vfmsub231ps_fma(auVar53,auVar32,auVar46);
          uVar9 = *(undefined4 *)(ray + k * 4);
          auVar48._4_4_ = uVar9;
          auVar48._0_4_ = uVar9;
          auVar48._8_4_ = uVar9;
          auVar48._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar57._4_4_ = uVar9;
          auVar57._0_4_ = uVar9;
          auVar57._8_4_ = uVar9;
          auVar57._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar29._4_4_ = uVar9;
          auVar29._0_4_ = uVar9;
          auVar29._8_4_ = uVar9;
          auVar29._12_4_ = uVar9;
          fVar58 = *(float *)(ray + k * 4 + 0x80);
          auVar83._4_4_ = fVar58;
          auVar83._0_4_ = fVar58;
          auVar83._8_4_ = fVar58;
          auVar83._12_4_ = fVar58;
          auVar28 = vsubps_avx(auVar34,auVar48);
          fVar65 = *(float *)(ray + k * 4 + 0xa0);
          auVar87._4_4_ = fVar65;
          auVar87._0_4_ = fVar65;
          auVar87._8_4_ = fVar65;
          auVar87._12_4_ = fVar65;
          auVar34 = vsubps_avx(auVar30,auVar57);
          fVar70 = *(float *)(ray + k * 4 + 0xc0);
          auVar88._4_4_ = fVar70;
          auVar88._0_4_ = fVar70;
          auVar88._8_4_ = fVar70;
          auVar88._12_4_ = fVar70;
          auVar29 = vsubps_avx(auVar31,auVar29);
          auVar30._0_4_ = fVar58 * auVar34._0_4_;
          auVar30._4_4_ = fVar58 * auVar34._4_4_;
          auVar30._8_4_ = fVar58 * auVar34._8_4_;
          auVar30._12_4_ = fVar58 * auVar34._12_4_;
          auVar30 = vfmsub231ps_fma(auVar30,auVar28,auVar87);
          auVar67._0_4_ = auVar32._0_4_ * auVar30._0_4_;
          auVar67._4_4_ = auVar32._4_4_ * auVar30._4_4_;
          auVar67._8_4_ = auVar32._8_4_ * auVar30._8_4_;
          auVar67._12_4_ = auVar32._12_4_ * auVar30._12_4_;
          auVar31._0_4_ = auVar38._0_4_ * auVar30._0_4_;
          auVar31._4_4_ = auVar38._4_4_ * auVar30._4_4_;
          auVar31._8_4_ = auVar38._8_4_ * auVar30._8_4_;
          auVar31._12_4_ = auVar38._12_4_ * auVar30._12_4_;
          auVar62._0_4_ = fVar70 * auVar28._0_4_;
          auVar62._4_4_ = fVar70 * auVar28._4_4_;
          auVar62._8_4_ = fVar70 * auVar28._8_4_;
          auVar62._12_4_ = fVar70 * auVar28._12_4_;
          auVar32 = vfmsub231ps_fma(auVar62,auVar29,auVar83);
          auVar38 = vfmadd231ps_fma(auVar67,auVar32,auVar59);
          auVar32 = vfmadd231ps_fma(auVar31,auVar39,auVar32);
          auVar63._0_4_ = auVar59._0_4_ * auVar46._0_4_;
          auVar63._4_4_ = auVar59._4_4_ * auVar46._4_4_;
          auVar63._8_4_ = auVar59._8_4_ * auVar46._8_4_;
          auVar63._12_4_ = auVar59._12_4_ * auVar46._12_4_;
          local_10f0 = vfmsub231ps_fma(auVar63,auVar52,auVar39);
          auVar78._0_4_ = fVar65 * auVar29._0_4_;
          auVar78._4_4_ = fVar65 * auVar29._4_4_;
          auVar78._8_4_ = fVar65 * auVar29._8_4_;
          auVar78._12_4_ = fVar65 * auVar29._12_4_;
          auVar30 = vfmsub231ps_fma(auVar78,auVar34,auVar88);
          auVar80._0_4_ = fVar70 * local_10f0._0_4_;
          auVar80._4_4_ = fVar70 * local_10f0._4_4_;
          auVar80._8_4_ = fVar70 * local_10f0._8_4_;
          auVar80._12_4_ = fVar70 * local_10f0._12_4_;
          auVar39 = vfmadd231ps_fma(auVar80,local_1100,auVar87);
          auVar59 = vfmadd231ps_fma(auVar39,local_1110,auVar83);
          auVar38 = vfmadd231ps_fma(auVar38,auVar30,auVar52);
          auVar39 = vandps_avx(auVar59,local_1200);
          uVar13 = auVar39._0_4_;
          local_11a0._0_4_ = (float)(uVar13 ^ auVar38._0_4_);
          uVar74 = auVar39._4_4_;
          local_11a0._4_4_ = (float)(uVar74 ^ auVar38._4_4_);
          uVar75 = auVar39._8_4_;
          local_11a0._8_4_ = (float)(uVar75 ^ auVar38._8_4_);
          uVar76 = auVar39._12_4_;
          local_11a0._12_4_ = (float)(uVar76 ^ auVar38._12_4_);
          auVar39 = vfmadd231ps_fma(auVar32,auVar46,auVar30);
          local_1190._0_4_ = (float)(uVar13 ^ auVar39._0_4_);
          local_1190._4_4_ = (float)(uVar74 ^ auVar39._4_4_);
          local_1190._8_4_ = (float)(uVar75 ^ auVar39._8_4_);
          local_1190._12_4_ = (float)(uVar76 ^ auVar39._12_4_);
          auVar38 = ZEXT816(0) << 0x20;
          auVar39 = vcmpps_avx(local_11a0,auVar38,5);
          auVar46 = vcmpps_avx(local_1190,auVar38,5);
          auVar39 = vandps_avx(auVar46,auVar39);
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          local_1170 = vandps_avx(auVar59,auVar68);
          auVar46 = vcmpps_avx(auVar59,auVar38,4);
          auVar39 = vandps_avx(auVar46,auVar39);
          auVar32._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
          auVar32._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
          auVar32._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
          auVar32._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
          auVar46 = vcmpps_avx(auVar32,local_1170,2);
          auVar38 = auVar46 & auVar39;
          local_1348 = uVar11;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar39 = vandps_avx(auVar39,auVar46);
            auVar33._0_4_ = local_10f0._0_4_ * auVar29._0_4_;
            auVar33._4_4_ = local_10f0._4_4_ * auVar29._4_4_;
            auVar33._8_4_ = local_10f0._8_4_ * auVar29._8_4_;
            auVar33._12_4_ = local_10f0._12_4_ * auVar29._12_4_;
            auVar46 = vfmadd213ps_fma(auVar34,local_1100,auVar33);
            auVar46 = vfmadd213ps_fma(auVar28,local_1110,auVar46);
            local_1180._0_4_ = (float)(uVar13 ^ auVar46._0_4_);
            local_1180._4_4_ = (float)(uVar74 ^ auVar46._4_4_);
            local_1180._8_4_ = (float)(uVar75 ^ auVar46._8_4_);
            local_1180._12_4_ = (float)(uVar76 ^ auVar46._12_4_);
            fVar58 = *(float *)(ray + k * 4 + 0x60);
            auVar34._0_4_ = local_1170._0_4_ * fVar58;
            auVar34._4_4_ = local_1170._4_4_ * fVar58;
            auVar34._8_4_ = local_1170._8_4_ * fVar58;
            auVar34._12_4_ = local_1170._12_4_ * fVar58;
            auVar46 = vcmpps_avx(auVar34,local_1180,1);
            fVar58 = *(float *)(ray + k * 4 + 0x100);
            auVar49._0_4_ = local_1170._0_4_ * fVar58;
            auVar49._4_4_ = local_1170._4_4_ * fVar58;
            auVar49._8_4_ = local_1170._8_4_ * fVar58;
            auVar49._12_4_ = local_1170._12_4_ * fVar58;
            auVar38 = vcmpps_avx(local_1180,auVar49,2);
            auVar46 = vandps_avx(auVar46,auVar38);
            auVar38 = auVar39 & auVar46;
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              local_1360 = vandps_avx(auVar39,auVar46);
              local_1150 = local_1360;
              auVar39 = vrcpps_avx(local_1170);
              auVar42._8_4_ = 0x3f800000;
              auVar42._0_8_ = 0x3f8000003f800000;
              auVar42._12_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_fma(local_1170,auVar39,auVar42);
              auVar39 = vfmadd132ps_fma(auVar46,auVar39,auVar39);
              fVar65 = auVar39._0_4_;
              local_1120._0_4_ = fVar65 * local_1180._0_4_;
              fVar70 = auVar39._4_4_;
              local_1120._4_4_ = fVar70 * local_1180._4_4_;
              fVar71 = auVar39._8_4_;
              local_1120._8_4_ = fVar71 * local_1180._8_4_;
              fVar72 = auVar39._12_4_;
              local_1120._12_4_ = fVar72 * local_1180._12_4_;
              auVar37 = ZEXT1664(local_1120);
              local_1140[0] = fVar65 * local_11a0._0_4_;
              local_1140[1] = fVar70 * local_11a0._4_4_;
              local_1140[2] = fVar71 * local_11a0._8_4_;
              local_1140[3] = fVar72 * local_11a0._12_4_;
              auVar43._8_4_ = 0x7f800000;
              auVar43._0_8_ = 0x7f8000007f800000;
              auVar43._12_4_ = 0x7f800000;
              auVar39 = vblendvps_avx(auVar43,local_1120,local_1360);
              local_1130[0] = fVar65 * local_1190._0_4_;
              local_1130[1] = fVar70 * local_1190._4_4_;
              local_1130[2] = fVar71 * local_1190._8_4_;
              local_1130[3] = fVar72 * local_1190._12_4_;
              auVar46 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar46 = vminps_avx(auVar46,auVar39);
              auVar38 = vshufpd_avx(auVar46,auVar46,1);
              auVar46 = vminps_avx(auVar38,auVar46);
              auVar39 = vcmpps_avx(auVar39,auVar46,0);
              auVar38 = local_1360 & auVar39;
              auVar46 = vpcmpeqd_avx(auVar46,auVar46);
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                auVar46 = auVar39;
              }
              auVar39 = vandps_avx(local_1360,auVar46);
              local_1350 = pSVar16;
              do {
                auVar39 = vpslld_avx(auVar39,0x1f);
                uVar9 = vmovmskps_avx(auVar39);
                uVar22 = 0;
                for (uVar11 = CONCAT44((int)(uVar11 >> 0x20),uVar9); (uVar11 & 1) == 0;
                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                  uVar22 = uVar22 + 1;
                }
                uVar13 = *(uint *)((long)&local_11b0 + uVar22 * 4);
                uVar11 = (ulong)uVar13;
                pGVar3 = (pSVar16->geometries).items[uVar11].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1360 + uVar22 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar11 = (ulong)(uint)((int)uVar22 << 2);
                    uVar9 = *(undefined4 *)((long)local_1140 + uVar11);
                    uVar2 = *(undefined4 *)((long)local_1130 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1110 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1100 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_10f0 + uVar11);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_12b0 + uVar11);
                    *(uint *)(ray + k * 4 + 0x240) = uVar13;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_1320 = auVar37._0_16_;
                  uVar11 = (ulong)(uint)((int)uVar22 * 4);
                  uVar9 = *(undefined4 *)((long)local_1140 + uVar11);
                  local_1060._4_4_ = uVar9;
                  local_1060._0_4_ = uVar9;
                  local_1060._8_4_ = uVar9;
                  local_1060._12_4_ = uVar9;
                  local_1060._16_4_ = uVar9;
                  local_1060._20_4_ = uVar9;
                  local_1060._24_4_ = uVar9;
                  local_1060._28_4_ = uVar9;
                  local_1040 = *(undefined4 *)((long)local_1130 + uVar11);
                  uVar9 = *(undefined4 *)((long)&local_12b0 + uVar11);
                  auVar54._4_4_ = uVar9;
                  auVar54._0_4_ = uVar9;
                  auVar54._8_4_ = uVar9;
                  auVar54._12_4_ = uVar9;
                  auVar55._16_4_ = uVar9;
                  auVar55._0_16_ = auVar54;
                  auVar55._20_4_ = uVar9;
                  auVar55._24_4_ = uVar9;
                  auVar55._28_4_ = uVar9;
                  local_10c0._4_4_ = *(undefined4 *)(local_1110 + uVar11);
                  local_10a0 = *(undefined4 *)(local_1100 + uVar11);
                  uVar9 = *(undefined4 *)(local_10f0 + uVar11);
                  local_1080._4_4_ = uVar9;
                  local_1080._0_4_ = uVar9;
                  local_1080._8_4_ = uVar9;
                  local_1080._12_4_ = uVar9;
                  local_1080._16_4_ = uVar9;
                  local_1080._20_4_ = uVar9;
                  local_1080._24_4_ = uVar9;
                  local_1080._28_4_ = uVar9;
                  auVar50._4_4_ = uVar13;
                  auVar50._0_4_ = uVar13;
                  auVar50._8_4_ = uVar13;
                  auVar50._12_4_ = uVar13;
                  auVar51._16_4_ = uVar13;
                  auVar51._0_16_ = auVar50;
                  auVar51._20_4_ = uVar13;
                  auVar51._24_4_ = uVar13;
                  auVar51._28_4_ = uVar13;
                  local_10c0._0_4_ = local_10c0._4_4_;
                  local_10c0._8_4_ = local_10c0._4_4_;
                  local_10c0._12_4_ = local_10c0._4_4_;
                  uStack_10b0 = local_10c0._4_4_;
                  uStack_10ac = local_10c0._4_4_;
                  uStack_10a8 = local_10c0._4_4_;
                  uStack_10a4 = local_10c0._4_4_;
                  uStack_109c = local_10a0;
                  uStack_1098 = local_10a0;
                  uStack_1094 = local_10a0;
                  uStack_1090 = local_10a0;
                  uStack_108c = local_10a0;
                  uStack_1088 = local_10a0;
                  uStack_1084 = local_10a0;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  local_1020 = auVar55;
                  local_1000 = auVar51;
                  vpcmpeqd_avx2(local_1060,local_1060);
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1120 + uVar11);
                  local_12a0 = local_10e0;
                  local_12e0.valid = (int *)local_12a0;
                  local_12e0.geometryUserPtr = pGVar3->userPtr;
                  local_12e0.context = context->user;
                  local_12e0.hit = (RTCHitN *)local_10c0;
                  local_12e0.N = 8;
                  local_12e0.ray = (RTCRayN *)ray;
                  if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar51 = ZEXT1632(auVar50);
                    auVar55 = ZEXT1632(auVar54);
                    (*pGVar3->intersectionFilterN)(&local_12e0);
                  }
                  auVar36 = vpcmpeqd_avx2(local_12a0,_DAT_01faff00);
                  auVar45 = _DAT_01fe9960 & ~auVar36;
                  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar45 >> 0x7f,0) == '\0') &&
                        (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar45 >> 0xbf,0) == '\0') &&
                      (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar45[0x1f]) {
                    auVar36 = auVar36 ^ _DAT_01fe9960;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar51 = ZEXT1632(auVar51._0_16_);
                      auVar55 = ZEXT1632(auVar55._0_16_);
                      (*p_Var4)(&local_12e0);
                    }
                    auVar5 = vpcmpeqd_avx2(local_12a0,_DAT_01faff00);
                    auVar45 = vpcmpeqd_avx2(auVar55,auVar55);
                    auVar36 = auVar5 ^ auVar45;
                    auVar51 = vpcmpeqd_avx2(auVar51,auVar51);
                    auVar45 = auVar45 & ~auVar5;
                    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar45 >> 0x7f,0) != '\0') ||
                          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar45 >> 0xbf,0) != '\0') ||
                        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar45[0x1f] < '\0') {
                      auVar5 = auVar5 ^ auVar51;
                      auVar45 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])local_12e0.hit);
                      *(undefined1 (*) [32])(local_12e0.ray + 0x180) = auVar45;
                      auVar45 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_12e0.ray + 0x1a0) = auVar45;
                      auVar45 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_12e0.ray + 0x1c0) = auVar45;
                      auVar45 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_12e0.ray + 0x1e0) = auVar45;
                      auVar45 = vmaskmovps_avx(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_12e0.ray + 0x200) = auVar45;
                      auVar45 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_12e0.ray + 0x220) = auVar45;
                      auVar45 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_12e0.ray + 0x240) = auVar45;
                      auVar45 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])(local_12e0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_12e0.ray + 0x260) = auVar45;
                      auVar45 = vpmaskmovd_avx2(auVar5,*(undefined1 (*) [32])
                                                        (local_12e0.hit + 0x100));
                      *(undefined1 (*) [32])(local_12e0.ray + 0x280) = auVar45;
                    }
                  }
                  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar36 >> 0x7f,0) == '\0') &&
                        (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar36 >> 0xbf,0) == '\0') &&
                      (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar36[0x1f]) {
                    *(float *)(ray + k * 4 + 0x100) = fVar58;
                  }
                  else {
                    fVar58 = *(float *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_1360 + uVar22 * 4) = 0;
                  auVar35._4_4_ = fVar58;
                  auVar35._0_4_ = fVar58;
                  auVar35._8_4_ = fVar58;
                  auVar35._12_4_ = fVar58;
                  auVar37 = ZEXT1664(local_1320);
                  auVar39 = vcmpps_avx(local_1320,auVar35,2);
                  local_1360 = vandps_avx(auVar39,local_1360);
                  uVar11 = uVar22;
                  pSVar16 = local_1350;
                }
                if ((((local_1360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1360[0xf]) break;
                auVar44._8_4_ = 0x7f800000;
                auVar44._0_8_ = 0x7f8000007f800000;
                auVar44._12_4_ = 0x7f800000;
                auVar39 = vblendvps_avx(auVar44,auVar37._0_16_,local_1360);
                auVar46 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar46 = vminps_avx(auVar46,auVar39);
                auVar38 = vshufpd_avx(auVar46,auVar46,1);
                auVar46 = vminps_avx(auVar38,auVar46);
                auVar46 = vcmpps_avx(auVar39,auVar46,0);
                auVar38 = local_1360 & auVar46;
                auVar39 = local_1360;
                if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar38[0xf] < '\0') {
                  auVar39 = vandps_avx(auVar46,local_1360);
                }
                auVar39 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar39);
              } while( true );
            }
          }
          uVar11 = local_1348 + 1;
        } while (uVar11 != local_1308);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
      auVar64 = ZEXT1664(local_1210);
      auVar69 = ZEXT1664(local_1220);
      auVar73 = ZEXT1664(local_1230);
      auVar79 = ZEXT1664(local_1240);
      auVar81 = ZEXT1664(local_1250);
      auVar84 = ZEXT1664(local_1260);
      auVar86 = ZEXT1664(local_1270);
      uVar11 = local_1310;
    }
    if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }